

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ASL_AB(CPU *this)

{
  uint16_t uVar1;
  byte data;
  byte bVar2;
  
  this->cycles = 6;
  uVar1 = GetWord(this);
  bVar2 = ReadByte(this,uVar1 & 0xff);
  this->cycles = this->cycles - 1;
  data = bVar2 * '\x02';
  (this->field_6).ps = data & 0x80 | (data == 0) * '\x02' | (this->field_6).ps & 0x7c | bVar2 >> 7;
  WriteByte(this,uVar1 & 0xff,data);
  return;
}

Assistant:

void CPU::ASL_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}